

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.h
# Opt level: O2

StringVector * __thiscall
CoreML::Specification::DictVectorizer::mutable_stringtoindex(DictVectorizer *this)

{
  StringVector *this_00;
  
  if (this->_oneof_case_[0] == 1) {
    this_00 = (this->Map_).stringtoindex_;
  }
  else {
    clear_Map(this);
    this->_oneof_case_[0] = 1;
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->Map_).stringtoindex_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::StringVector* DictVectorizer::mutable_stringtoindex() {
  if (!has_stringtoindex()) {
    clear_Map();
    set_has_stringtoindex();
    Map_.stringtoindex_ = new ::CoreML::Specification::StringVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.DictVectorizer.stringToIndex)
  return Map_.stringtoindex_;
}